

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O3

void __thiscall QtMWidgets::Stepper::Stepper(Stepper *this,QWidget *parent)

{
  QTimer *pQVar1;
  StepperPrivate *this_00;
  undefined4 *puVar2;
  QObject local_40 [8];
  code *local_38;
  ImplFn local_30;
  code *local_28;
  undefined8 local_20;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001951c8;
  *(undefined ***)&this->field_0x10 = &PTR__Stepper_00195378;
  this_00 = (StepperPrivate *)operator_new(0x48);
  StepperPrivate::StepperPrivate(this_00,this);
  (this->d).d = this_00;
  QWidget::setSizePolicy((QSizePolicy)SUB84(this,0));
  pQVar1 = ((this->d).d)->timer;
  local_28 = QTimer::timeout;
  local_20 = 0;
  local_38 = _q_autorepeat;
  local_30 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::Stepper::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = _q_autorepeat;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pQVar1,(QObject *)&local_28,(void **)this,
             (QSlotObjectBase *)&local_38,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  return;
}

Assistant:

Stepper::Stepper( QWidget * parent )
	:	QWidget( parent )
	,	d( new StepperPrivate( this ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed, QSizePolicy::Fixed ) );

	connect( d->timer, &QTimer::timeout,
		this, &Stepper::_q_autorepeat );
}